

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Emplace<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
::TestBody(Emplace<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
           *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  pointer *__ptr_1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  T val2;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
  p;
  T val;
  TypeParam m;
  AssertHelper local_128;
  AssertHelper local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  undefined1 local_110 [8];
  anon_union_8_1_a8a14541_for_iterator_1 aStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  undefined1 local_d8 [24];
  result_type_conflict1 local_c0;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
  local_b8;
  pair<const_phmap::priv::NonStandardLayout,_int> local_98;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_68;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_98,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)&local_68);
  local_68.size_ = 0;
  local_68.capacity_ = 0;
  local_68.ctrl_ = (ctrl_t *)0x0;
  local_68.slots_ = (slot_type *)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
  ._M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
        )(Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>)0x0;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_68.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            (&local_b8,&local_68,&local_98);
  local_110[0] = (internal)local_b8.second;
  aStack_108.slot_ = (slot_type *)0x0;
  if (local_b8.second == false) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_110,(AssertionResult *)"p.second","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x88,(char *)local_e8);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_e8 != (undefined1  [8])local_d8) {
      operator_delete((void *)local_e8,local_d8._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_120.data_._1_7_,local_120.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_120.data_._1_7_,local_120.data_._0_1_) + 8))();
    }
  }
  if (aStack_108.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_108.slot_);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_e8,"val","*p.first",&local_98,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_b8.first.field_1.slot_);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_e0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((param_type)local_110 != (param_type)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_p)
    ;
  }
  local_110._0_4_ = 0;
  local_110._4_4_ = 0x7fffffff;
  __urng = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_110,__urng,(param_type *)local_110);
  local_e8 = (undefined1  [8])&PTR__NonStandardLayout_0032a340;
  local_e0._M_p = local_d8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_98.first.value._M_dataplus._M_p,
             local_98.first.value._M_dataplus._M_p + local_98.first.value._M_string_length);
  local_c0 = rVar1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::emplace<std::pair<const_phmap::priv::NonStandardLayout,_int>_&,_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_bool>
              *)local_110,&local_68,(pair<const_phmap::priv::NonStandardLayout,_int> *)local_e8);
  local_b8.first.ctrl_ = (ctrl_t *)local_110;
  local_b8.first.field_1.slot_ = (slot_type *)aStack_108;
  local_b8.second = (bool)local_100._M_local_buf[0];
  local_120.data_._0_1_ = (internal)(local_100._M_local_buf[0] ^ 1);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_100._M_local_buf[0] != false) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)&local_120,(AssertionResult *)"p.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8c,(char *)local_110);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])((long)local_110 + 0x10)) {
      operator_delete((void *)local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
    if (local_128.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_128.data_ + 8))();
    }
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,local_118);
  }
  testing::internal::
  CmpHelperEQ<std::pair<phmap::priv::NonStandardLayout_const,int>,std::pair<phmap::priv::NonStandardLayout_const,int>>
            ((internal *)local_110,"val","*p.first",&local_98,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_b8.first.field_1.slot_);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (aStack_108.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)aStack_108.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((long *)CONCAT71(local_120.data_._1_7_,local_120.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_120.data_._1_7_,local_120.data_._0_1_) + 8))();
    }
  }
  if (aStack_108.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_108.slot_);
  }
  local_e8 = (undefined1  [8])&PTR__NonStandardLayout_0032a340;
  if (local_e0._M_p != local_d8 + 8) {
    operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
  }
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::destroy_slots(&local_68);
  local_98.first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0032a340;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.first.value._M_dataplus._M_p != &local_98.first.value.field_2) {
    operator_delete(local_98.first.value._M_dataplus._M_p,
                    local_98.first.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Emplace) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto p = m.emplace(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.emplace(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}